

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rbuVfsClose(sqlite3_file *pFile)

{
  sqlite3_file *psVar1;
  _func_int_sqlite3_file_ptr_sqlite3_int64_ptr **pp_Var2;
  _func_int_sqlite3_file_ptr_int **pp_Var3;
  int iVar4;
  sqlite3_io_methods *psVar5;
  _func_int_sqlite3_file_ptr_int **pp_Var6;
  _func_int_sqlite3_file_ptr_sqlite3_int64_ptr **pp_Var7;
  int i;
  long lVar8;
  
  for (lVar8 = 0; lVar8 < *(int *)((long)&pFile[6].pMethods + 4); lVar8 = lVar8 + 1) {
    sqlite3_free(*(void **)(&(pFile[7].pMethods)->iVersion + lVar8 * 2));
  }
  sqlite3_free(pFile[7].pMethods);
  pFile[7].pMethods = (sqlite3_io_methods *)0x0;
  sqlite3_free(pFile[8].pMethods);
  if ((*(uint *)&pFile[5].pMethods >> 8 & 1) == 0) {
    if (((*(uint *)&pFile[5].pMethods & 8) != 0) && (pFile[3].pMethods != (sqlite3_io_methods *)0x0)
       ) {
      rbuUpdateTempSize((rbu_file *)pFile,0);
    }
  }
  else {
    psVar5 = pFile[2].pMethods;
    if ((sqlite3_mutex *)psVar5[1].xWrite != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)((sqlite3_mutex *)psVar5[1].xWrite);
      psVar5 = pFile[2].pMethods;
    }
    pp_Var3 = &psVar5[1].xSync;
    do {
      pp_Var6 = pp_Var3;
      psVar1 = (sqlite3_file *)*pp_Var6;
      if (psVar1 == (sqlite3_file *)0x0) break;
      pp_Var3 = (_func_int_sqlite3_file_ptr_int **)(psVar1 + 0xb);
    } while (psVar1 != pFile);
    if (psVar1 != (sqlite3_file *)0x0) {
      *pp_Var6 = (_func_int_sqlite3_file_ptr_int *)pFile[0xb].pMethods;
      psVar5 = pFile[2].pMethods;
    }
    pFile[0xb].pMethods = (sqlite3_io_methods *)0x0;
    pp_Var2 = &psVar5[1].xFileSize;
    do {
      pp_Var7 = pp_Var2;
      psVar1 = (sqlite3_file *)*pp_Var7;
      if (psVar1 == (sqlite3_file *)0x0) break;
      pp_Var2 = (_func_int_sqlite3_file_ptr_sqlite3_int64_ptr **)(psVar1 + 0xc);
    } while (psVar1 != pFile);
    if (psVar1 != (sqlite3_file *)0x0) {
      *pp_Var7 = (_func_int_sqlite3_file_ptr_sqlite3_int64_ptr *)pFile[0xc].pMethods;
      psVar5 = pFile[2].pMethods;
    }
    pFile[0xc].pMethods = (sqlite3_io_methods *)0x0;
    if ((sqlite3_mutex *)psVar5[1].xWrite != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)((sqlite3_mutex *)psVar5[1].xWrite);
    }
    rbuUnlockShm((rbu_file *)pFile);
    (**(code **)(*(long *)pFile[1].pMethods + 0x80))(pFile[1].pMethods,0);
  }
  iVar4 = (**(code **)(*(long *)pFile[1].pMethods + 8))();
  return iVar4;
}

Assistant:

static int rbuVfsClose(sqlite3_file *pFile){
  rbu_file *p = (rbu_file*)pFile;
  int rc;
  int i;

  /* Free the contents of the apShm[] array. And the array itself. */
  for(i=0; i<p->nShm; i++){
    sqlite3_free(p->apShm[i]);
  }
  sqlite3_free(p->apShm);
  p->apShm = 0;
  sqlite3_free(p->zDel);

  if( p->openFlags & SQLITE_OPEN_MAIN_DB ){
    rbuMainlistRemove(p);
    rbuUnlockShm(p);
    p->pReal->pMethods->xShmUnmap(p->pReal, 0);
  }
  else if( (p->openFlags & SQLITE_OPEN_DELETEONCLOSE) && p->pRbu ){
    rbuUpdateTempSize(p, 0);
  }
  assert( p->pMainNext==0 && p->pRbuVfs->pMain!=p );

  /* Close the underlying file handle */
  rc = p->pReal->pMethods->xClose(p->pReal);
  return rc;
}